

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test::TestBody
          (SimplexTest_EqualityRowBoundedVarsOptimalSolution_Test *this)

{
  initializer_list<double> l;
  initializer_list<double> l_00;
  bool bVar1;
  char *pcVar2;
  double in_RDI;
  LP *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  double in_stack_00000250;
  double in_stack_00000258;
  char *in_stack_00000260;
  char *in_stack_00000268;
  double in_stack_fffffffffffffe88;
  DVector *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  ColType in_stack_fffffffffffffe9c;
  LP *in_stack_fffffffffffffea0;
  DVector *this_01;
  iterator in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeb0;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar3;
  RowType type;
  AssertHelper local_f8;
  Message local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  SimplexTest *in_stack_ffffffffffffff40;
  AssertionResult local_a8;
  AssertHelper local_98;
  Message local_90;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60 [2];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  this_00 = (LP *)((long)in_RDI + 0x10);
  uVar3 = 1;
  type = 0x40140000;
  LP::add_column(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 (double)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,9.34844335515931e-318);
  LP::add_column(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                 (double)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,9.34858663419661e-318);
  local_40 = 0x3ff0000000000000;
  local_38 = 0xbff0000000000000;
  local_30 = &local_40;
  local_28 = 2;
  l._M_len = in_stack_fffffffffffffeb0;
  l._M_array = in_stack_fffffffffffffea8;
  DVector::DVector((DVector *)in_stack_fffffffffffffea0,l);
  LP::add_row(this_00,type,(double)CONCAT44(uVar3,in_stack_fffffffffffffee0),in_RDI,
              (DVector *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  DVector::~DVector((DVector *)0x1cdfda);
  SimplexTest::solve_lp(in_stack_ffffffffffffff40);
  local_64 = 1;
  testing::internal::EqHelper<false>::Compare<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((char *)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
             (Result *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (Result *)in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1ce09d);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x1ce0fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce14f);
  this_02 = &local_88;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    in_stack_fffffffffffffea8 =
         (iterator)testing::AssertionResult::failure_message((AssertionResult *)0x1ce1ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x37,(char *)in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message((Message *)0x1ce247);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce29f);
  local_e8 = 0x4014000000000000;
  uStack_e0 = 0x4014000000000000;
  local_d8 = 0;
  local_d0 = &local_e8;
  local_c8 = 3;
  this_01 = (DVector *)&stack0xffffffffffffff40;
  l_00._M_len = (size_type)this_02;
  l_00._M_array = in_stack_fffffffffffffea8;
  DVector::DVector(this_01,l_00);
  testing::internal::EqHelper<false>::Compare<fizplex::DVector,fizplex::DVector>
            ((char *)in_stack_fffffffffffffea8,(char *)this_01,
             (DVector *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             in_stack_fffffffffffffe90);
  DVector::~DVector((DVector *)0x1ce333);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1ce3c2);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message((Message *)0x1ce41f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ce474);
  return;
}

Assistant:

TEST_F(SimplexTest, EqualityRowBoundedVarsOptimalSolution) {
  lp.add_column(ColType::Bounded, 0, 5, -1);
  lp.add_column(ColType::Bounded, 0, 5, 0);
  lp.add_row(RowType::Equality, 0, 0, {1, -1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-5.0, z);
  EXPECT_EQ(DVector({5.0, 5.0, 0.0}), x);
}